

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

pair<bool,_spvtools::opt::Loop_*> __thiscall
spvtools::opt::LoopPeelingPass::ProcessLoop(LoopPeelingPass *this,Loop *loop,CodeMetrics *loop_size)

{
  CodeMetrics *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  Analysis preserved_analyses;
  uint32_t uVar5;
  IRContext *pIVar6;
  Instruction *pIVar7;
  Instruction *branch_inst;
  BasicBlock *pBVar8;
  TypeManager *this_00;
  Type *pTVar9;
  undefined4 extraout_var;
  BasicBlockListTy *this_01;
  reference pvVar10;
  CFG *this_02;
  uint *puVar11;
  ulong uVar12;
  undefined8 extraout_RAX;
  pair<bool,_spvtools::opt::Loop_*> pVar13;
  bool local_231;
  bool local_209;
  PeelDirection local_208 [2];
  Loop *local_200;
  Loop *extra_opportunity;
  uint32_t factor;
  PeelDirection direction;
  Direction local_1e0;
  uint local_1d8;
  uint local_1d4;
  uint32_t factor_1;
  PeelDirection direction_1;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_1c0;
  uint32_t block;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  uint32_t peel_after_factor;
  uint32_t peel_before_factor;
  LoopPeelingInfo peel_info;
  InstructionBuilder local_178;
  undefined1 local_158 [8];
  LoopPeeling peeler;
  undefined1 auStack_b8 [7];
  bool is_signed;
  ScalarEvolutionAnalysis *local_b0;
  LoopPeelingPass *local_a8;
  function<bool_(spvtools::opt::Instruction_*)> local_a0;
  Instruction *local_80;
  Instruction *canonical_induction_variable;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_70;
  size_t iterations;
  Instruction *exiting_iv;
  BasicBlock *exit_block;
  bool local_49;
  LoopPeelingPass *local_48;
  pair<bool,_spvtools::opt::Loop_*> bail_out;
  ScalarEvolutionAnalysis *scev_analysis;
  CodeMetrics *loop_size_local;
  Loop *loop_local;
  LoopPeelingPass *this_local;
  Loop *local_10;
  
  loop_size_local = (CodeMetrics *)loop;
  loop_local = (Loop *)this;
  pIVar6 = Pass::context(&this->super_Pass);
  bail_out.second = (Loop *)IRContext::GetScalarEvolutionAnalysis(pIVar6);
  local_49 = false;
  exit_block = (BasicBlock *)0x0;
  std::pair<bool,_spvtools::opt::Loop_*>::pair<bool,_std::nullptr_t,_true>
            ((pair<bool,_spvtools::opt::Loop_*> *)&local_48,&local_49,&exit_block);
  exiting_iv = (Instruction *)Loop::FindConditionBlock((Loop *)loop_size_local);
  if ((BasicBlock *)exiting_iv == (BasicBlock *)0x0) {
    this_local = local_48;
    local_10 = (Loop *)bail_out._0_8_;
  }
  else {
    pIVar7 = Loop::FindConditionVariable((Loop *)loop_size_local,(BasicBlock *)exiting_iv);
    pCVar1 = loop_size_local;
    if (pIVar7 == (Instruction *)0x0) {
      this_local = local_48;
      local_10 = (Loop *)bail_out._0_8_;
    }
    else {
      local_70._M_head_impl = (Instruction *)0x0;
      iterations = (size_t)pIVar7;
      BasicBlock::tail((BasicBlock *)&canonical_induction_variable);
      branch_inst = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator*
                              ((iterator_template<spvtools::opt::Instruction> *)
                               &canonical_induction_variable);
      bVar2 = Loop::FindNumberOfIterations
                        ((Loop *)pCVar1,pIVar7,branch_inst,(size_t *)&local_70,(int64_t *)0x0,
                         (int64_t *)0x0);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        if (local_70._M_head_impl == (Instruction *)0x0) {
          this_local = local_48;
          local_10 = (Loop *)bail_out._0_8_;
        }
        else {
          local_80 = (Instruction *)0x0;
          pBVar8 = Loop::GetHeaderBlock((Loop *)loop_size_local);
          _auStack_b8 = &local_80;
          local_b0 = (ScalarEvolutionAnalysis *)bail_out.second;
          local_a8 = this;
          std::function<bool(spvtools::opt::Instruction*)>::
          function<spvtools::opt::LoopPeelingPass::ProcessLoop(spvtools::opt::Loop*,spvtools::opt::CodeMetrics*)::__0,void>
                    ((function<bool(spvtools::opt::Instruction*)> *)&local_a0,
                     (anon_class_24_3_7bfaaade *)auStack_b8);
          BasicBlock::WhileEachPhiInst(pBVar8,&local_a0,false);
          std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_a0);
          if (local_80 == (Instruction *)0x0) {
            local_231 = false;
          }
          else {
            pIVar6 = Pass::context(&this->super_Pass);
            this_00 = IRContext::get_type_mgr(pIVar6);
            uVar3 = opt::Instruction::type_id(local_80);
            pTVar9 = analysis::TypeManager::GetType(this_00,uVar3);
            iVar4 = (*pTVar9->_vptr_Type[9])();
            local_231 = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var,iVar4));
          }
          pCVar1 = loop_size_local;
          peeler.exit_value_._M_h._M_single_bucket._7_1_ = local_231;
          pIVar6 = Pass::context(&this->super_Pass);
          pBVar8 = Loop::GetHeaderBlock((Loop *)loop_size_local);
          preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
          InstructionBuilder::InstructionBuilder(&local_178,pIVar6,pBVar8,preserved_analyses);
          pIVar7 = InstructionBuilder::GetIntConstant<unsigned_int>
                             (&local_178,(uint)local_70._M_head_impl,
                              (bool)(peeler.exit_value_._M_h._M_single_bucket._7_1_ & 1));
          LoopPeeling::LoopPeeling((LoopPeeling *)local_158,(Loop *)pCVar1,pIVar7,local_80);
          bVar2 = LoopPeeling::CanPeelLoop((LoopPeeling *)local_158);
          if (bVar2) {
            LoopPeelingInfo::LoopPeelingInfo
                      ((LoopPeelingInfo *)&peel_after_factor,(Loop *)loop_size_local,
                       (size_t)local_70._M_head_impl,(ScalarEvolutionAnalysis *)bail_out.second);
            __range2._4_4_ = 0;
            __range2._0_4_ = 0;
            this_01 = Loop::GetBlocks((Loop *)loop_size_local);
            __end2 = std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::begin(this_01);
            _Stack_1c0._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(this_01);
            while (bVar2 = std::__detail::operator!=
                                     (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                                      &stack0xfffffffffffffe40), bVar2) {
              pvVar10 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*
                                  (&__end2);
              uVar3 = *pvVar10;
              bb._4_4_ = uVar3;
              uVar5 = BasicBlock::id((BasicBlock *)exiting_iv);
              if (uVar3 != uVar5) {
                this_02 = Pass::cfg(&this->super_Pass);
                _factor_1 = CFG::block(this_02,bb._4_4_);
                local_1e0 = LoopPeelingInfo::GetPeelingInfo
                                      ((LoopPeelingInfo *)&peel_after_factor,_factor_1);
                std::tie<spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>
                          (&factor,&local_1d4);
                std::tuple<spvtools::opt::LoopPeelingPass::PeelDirection&,unsigned_int&>::operator=
                          ((tuple<spvtools::opt::LoopPeelingPass::PeelDirection&,unsigned_int&> *)
                           &factor,&local_1e0);
                if (local_1d4 != 0) {
                  if (local_1d4 == 1) {
                    puVar11 = std::max<unsigned_int>((uint *)((long)&__range2 + 4),&local_1d8);
                    __range2._4_4_ = *puVar11;
                  }
                  else {
                    if (local_1d4 != 2) {
                      __assert_fail("direction == PeelDirection::kAfter",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                                    ,0x2c9,
                                    "std::pair<bool, Loop *> spvtools::opt::LoopPeelingPass::ProcessLoop(Loop *, CodeMetrics *)"
                                   );
                    }
                    puVar11 = std::max<unsigned_int>((uint *)&__range2,&local_1d8);
                    __range2._0_4_ = *puVar11;
                  }
                }
              }
              std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
            }
            extra_opportunity._0_4_ = 0;
            if (__range2._4_4_ != 0) {
              extra_opportunity._0_4_ = __range2._4_4_;
            }
            extra_opportunity._4_4_ = (uint)(__range2._4_4_ != 0);
            if (((uint)__range2 != 0) && (__range2._4_4_ < (uint)__range2)) {
              extra_opportunity._0_4_ = (uint)__range2;
              extra_opportunity._4_4_ = 2;
            }
            if (extra_opportunity._4_4_ == 0) {
              this_local = local_48;
              local_10 = (Loop *)bail_out._0_8_;
            }
            else {
              uVar12 = (ulong)(uint)extra_opportunity * loop_size->roi_size_;
              if (uVar12 < code_grow_threshold_ || uVar12 - code_grow_threshold_ == 0) {
                loop_size->roi_size_ = (ulong)(uint)extra_opportunity * loop_size->roi_size_;
                local_200 = (Loop *)0x0;
                if (extra_opportunity._4_4_ == 1) {
                  LoopPeeling::PeelBefore((LoopPeeling *)local_158,(uint)extra_opportunity);
                  if (this->stats_ != (LoopPeelingStats *)0x0) {
                    local_208[1] = 1;
                    std::
                    vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
                    ::
                    emplace_back<spvtools::opt::Loop*&,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int&>
                              ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
                                *)this->stats_,(Loop **)&loop_size_local,local_208 + 1,
                               (uint *)&extra_opportunity);
                  }
                  if ((uint)__range2 != 0) {
                    local_200 = LoopPeeling::GetOriginalLoop((LoopPeeling *)local_158);
                  }
                }
                else {
                  LoopPeeling::PeelAfter((LoopPeeling *)local_158,(uint)extra_opportunity);
                  if (this->stats_ != (LoopPeelingStats *)0x0) {
                    local_208[0] = kAfter;
                    std::
                    vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
                    ::
                    emplace_back<spvtools::opt::Loop*&,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int&>
                              ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
                                *)this->stats_,(Loop **)&loop_size_local,local_208,
                               (uint *)&extra_opportunity);
                  }
                  if (__range2._4_4_ != 0) {
                    local_200 = LoopPeeling::GetClonedLoop((LoopPeeling *)local_158);
                  }
                }
                local_209 = true;
                std::pair<bool,_spvtools::opt::Loop_*>::pair<bool,_spvtools::opt::Loop_*&,_true>
                          ((pair<bool,_spvtools::opt::Loop_*> *)&this_local,&local_209,&local_200);
              }
              else {
                this_local = local_48;
                local_10 = (Loop *)bail_out._0_8_;
              }
            }
          }
          else {
            this_local = local_48;
            local_10 = (Loop *)bail_out._0_8_;
          }
          peel_info.loop_max_iterations_._4_4_ = 1;
          LoopPeeling::~LoopPeeling((LoopPeeling *)local_158);
          bail_out._0_8_ = extraout_RAX;
        }
      }
      else {
        this_local = local_48;
        local_10 = (Loop *)bail_out._0_8_;
      }
    }
  }
  pVar13._1_7_ = bail_out._1_7_;
  pVar13.first = (bool)this_local._0_1_;
  pVar13.second = local_10;
  return pVar13;
}

Assistant:

std::pair<bool, Loop*> LoopPeelingPass::ProcessLoop(Loop* loop,
                                                    CodeMetrics* loop_size) {
  ScalarEvolutionAnalysis* scev_analysis =
      context()->GetScalarEvolutionAnalysis();
  // Default values for bailing out.
  std::pair<bool, Loop*> bail_out{false, nullptr};

  BasicBlock* exit_block = loop->FindConditionBlock();
  if (!exit_block) {
    return bail_out;
  }

  Instruction* exiting_iv = loop->FindConditionVariable(exit_block);
  if (!exiting_iv) {
    return bail_out;
  }
  size_t iterations = 0;
  if (!loop->FindNumberOfIterations(exiting_iv, &*exit_block->tail(),
                                    &iterations)) {
    return bail_out;
  }
  if (!iterations) {
    return bail_out;
  }

  Instruction* canonical_induction_variable = nullptr;

  loop->GetHeaderBlock()->WhileEachPhiInst([&canonical_induction_variable,
                                            scev_analysis,
                                            this](Instruction* insn) {
    if (const SERecurrentNode* iv =
            scev_analysis->AnalyzeInstruction(insn)->AsSERecurrentNode()) {
      const SEConstantNode* offset = iv->GetOffset()->AsSEConstantNode();
      const SEConstantNode* coeff = iv->GetCoefficient()->AsSEConstantNode();
      if (offset && coeff && offset->FoldToSingleValue() == 0 &&
          coeff->FoldToSingleValue() == 1) {
        if (context()->get_type_mgr()->GetType(insn->type_id())->AsInteger()) {
          canonical_induction_variable = insn;
          return false;
        }
      }
    }
    return true;
  });

  bool is_signed = canonical_induction_variable
                       ? context()
                             ->get_type_mgr()
                             ->GetType(canonical_induction_variable->type_id())
                             ->AsInteger()
                             ->IsSigned()
                       : false;

  LoopPeeling peeler(
      loop,
      InstructionBuilder(
          context(), loop->GetHeaderBlock(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping)
          .GetIntConstant<uint32_t>(static_cast<uint32_t>(iterations),
                                    is_signed),
      canonical_induction_variable);

  if (!peeler.CanPeelLoop()) {
    return bail_out;
  }

  // For each basic block in the loop, check if it can be peeled. If it
  // can, get the direction (before/after) and by which factor.
  LoopPeelingInfo peel_info(loop, iterations, scev_analysis);

  uint32_t peel_before_factor = 0;
  uint32_t peel_after_factor = 0;

  for (uint32_t block : loop->GetBlocks()) {
    if (block == exit_block->id()) {
      continue;
    }
    BasicBlock* bb = cfg()->block(block);
    PeelDirection direction;
    uint32_t factor;
    std::tie(direction, factor) = peel_info.GetPeelingInfo(bb);

    if (direction == PeelDirection::kNone) {
      continue;
    }
    if (direction == PeelDirection::kBefore) {
      peel_before_factor = std::max(peel_before_factor, factor);
    } else {
      assert(direction == PeelDirection::kAfter);
      peel_after_factor = std::max(peel_after_factor, factor);
    }
  }
  PeelDirection direction = PeelDirection::kNone;
  uint32_t factor = 0;

  // Find which direction we should peel.
  if (peel_before_factor) {
    factor = peel_before_factor;
    direction = PeelDirection::kBefore;
  }
  if (peel_after_factor) {
    if (peel_before_factor < peel_after_factor) {
      // Favor a peel after here and give the peel before another shot later.
      factor = peel_after_factor;
      direction = PeelDirection::kAfter;
    }
  }

  // Do the peel if we can.
  if (direction == PeelDirection::kNone) return bail_out;

  // This does not take into account branch elimination opportunities and
  // the unrolling. It assumes the peeled loop will be unrolled as well.
  if (factor * loop_size->roi_size_ > code_grow_threshold_) {
    return bail_out;
  }
  loop_size->roi_size_ *= factor;

  // Find if a loop should be peeled again.
  Loop* extra_opportunity = nullptr;

  if (direction == PeelDirection::kBefore) {
    peeler.PeelBefore(factor);
    if (stats_) {
      stats_->peeled_loops_.emplace_back(loop, PeelDirection::kBefore, factor);
    }
    if (peel_after_factor) {
      // We could have peeled after, give it another try.
      extra_opportunity = peeler.GetOriginalLoop();
    }
  } else {
    peeler.PeelAfter(factor);
    if (stats_) {
      stats_->peeled_loops_.emplace_back(loop, PeelDirection::kAfter, factor);
    }
    if (peel_before_factor) {
      // We could have peeled before, give it another try.
      extra_opportunity = peeler.GetClonedLoop();
    }
  }

  return {true, extra_opportunity};
}